

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = p + 1;
  if (*p == '[') {
    if (p[1] == '^') {
      pcVar2 = p + 2;
    }
    do {
      if (pcVar2 == ms->p_end) {
        luaL_error(ms->L,"malformed pattern (missing \']\')");
      }
      pcVar1 = pcVar2 + 1;
      if ((*pcVar2 == '%') && (pcVar1 < ms->p_end)) {
        pcVar1 = pcVar2 + 2;
      }
      pcVar2 = pcVar1;
    } while (*pcVar1 != ']');
    pcVar2 = pcVar1 + 1;
  }
  else if (*p == '%') {
    if (pcVar2 == ms->p_end) {
      luaL_error(ms->L,"malformed pattern (ends with \'%%\')");
    }
    pcVar2 = p + 2;
  }
  return pcVar2;
}

Assistant:

static const char *classend(MatchState *ms, const char *p) {
    switch (*p++) {
        case L_ESC: {
            if (p == ms->p_end)
                luaL_error(ms->L, "malformed pattern (ends with '%%')");
            return p + 1;
        }
        case '[': {
            if (*p == '^') p++;
            do {  /* look for a ']' */
                if (p == ms->p_end)
                    luaL_error(ms->L, "malformed pattern (missing ']')");
                if (*(p++) == L_ESC && p < ms->p_end)
                    p++;  /* skip escapes (e.g. '%]') */
            } while (*p != ']');
            return p + 1;
        }
        default: {
            return p;
        }
    }
}